

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_args.cc
# Opt level: O1

vw * VW::initialize(options_i *options,io_buf *model,bool skipModelLoad,
                   trace_message_t trace_listener,void *trace_context)

{
  element_type *peVar1;
  int iVar2;
  vw *all;
  typed_option<bool> *ptVar3;
  char cVar4;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  all_initial_regressor_files;
  io_buf localModel;
  string local_128;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_108;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_f0;
  io_buf local_d8;
  
  all = parse_args(options,trace_listener,trace_context);
  local_d8._vptr_io_buf = (_func_int **)&PTR_open_file_002d8490;
  local_d8.space._begin = (char *)0x0;
  local_d8.space._end = (char *)0x0;
  local_d8.space.end_array = (char *)0x0;
  local_d8.space.erase_count = 0;
  local_d8.files._begin = (int *)0x0;
  local_d8.files._end = (int *)0x0;
  local_d8.files.end_array = (int *)0x0;
  local_d8.files.erase_count = 0;
  local_d8.currentname._begin = (char *)0x0;
  local_d8.currentname._end = (char *)0x0;
  local_d8.currentname.end_array = (char *)0x0;
  local_d8.currentname.erase_count = 0;
  local_d8.finalname._begin = (char *)0x0;
  local_d8.finalname._end = (char *)0x0;
  local_d8.finalname.end_array = (char *)0x0;
  local_d8.finalname.erase_count = 0;
  v_array<char>::resize(&local_d8.space,0x10000);
  local_d8.count = 0;
  local_d8.current = 0;
  local_d8.head = local_d8.space._begin;
  local_d8._verify_hash = false;
  local_d8._hash = 0;
  if (model == (io_buf *)0x0) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&local_108,&all->initial_regressors);
    local_128._M_dataplus._M_p = (pointer)&local_128.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_128,"input_feature_regularizer","");
    iVar2 = (*options->_vptr_options_i[1])(options,&local_128);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_128._M_dataplus._M_p != &local_128.field_2) {
      operator_delete(local_128._M_dataplus._M_p);
    }
    if ((char)iVar2 != '\0') {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&local_108,&all->per_feature_regularizer_input);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&local_f0,&local_108);
    model = &local_d8;
    read_regressor_file(all,&local_f0,model);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_f0);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_108);
  }
  load_header_merge_options(options,all,model);
  parse_modules(options,all);
  parse_sources(options,all,model,skipModelLoad);
  (*options->_vptr_options_i[7])(options);
  local_128._M_dataplus._M_p = (pointer)&local_128.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_128,"help","");
  ptVar3 = config::options_i::get_typed_option<bool>(options,&local_128);
  peVar1 = (ptVar3->m_value).super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (peVar1 == (element_type *)0x0) {
    cVar4 = '\0';
  }
  else {
    cVar4 = *peVar1;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_128._M_dataplus._M_p != &local_128.field_2) {
    operator_delete(local_128._M_dataplus._M_p);
  }
  if (cVar4 == '\0') {
    (**(code **)(all->l + 0x10))(*(undefined8 *)all->l);
    io_buf::~io_buf(&local_d8);
    return all;
  }
  (*options->_vptr_options_i[2])(&local_128,options);
  std::operator<<((ostream *)&std::cout,(string *)&local_128);
  std::__cxx11::string::~string((string *)&local_128);
  exit(0);
}

Assistant:

vw* initialize(
    options_i& options, io_buf* model, bool skipModelLoad, trace_message_t trace_listener, void* trace_context)
{
  vw& all = parse_args(options, trace_listener, trace_context);

  try
  {
    // if user doesn't pass in a model, read from options
    io_buf localModel;
    if (!model)
    {
      std::vector<std::string> all_initial_regressor_files(all.initial_regressors);
      if (options.was_supplied("input_feature_regularizer"))
      {
        all_initial_regressor_files.push_back(all.per_feature_regularizer_input);
      }
      read_regressor_file(all, all_initial_regressor_files, localModel);
      model = &localModel;
    }

    // Loads header of model files and loads the command line options into the options object.
    load_header_merge_options(options, all, *model);

    parse_modules(options, all);

    parse_sources(options, all, *model, skipModelLoad);

    options.check_unregistered();

    // upon direct query for help -- spit it out to stdout;
    if (options.get_typed_option<bool>("help").value())
    {
      cout << options.help();
      exit(0);
    }

    all.l->init_driver();

    return &all;
  }
  catch (std::exception& e)
  {
    all.trace_message << "Error: " << e.what() << endl;
    finish(all);
    throw;
  }
  catch (...)
  {
    finish(all);
    throw;
  }
}